

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

char * flatbuffers::EnumName<unsigned_char>(uchar tval,TypeTable *type_table)

{
  int64_t iVar1;
  int64_t i;
  TypeTable *type_table_local;
  char *pcStack_10;
  uchar tval_local;
  
  if ((type_table == (TypeTable *)0x0) || (type_table->names == (char **)0x0)) {
    pcStack_10 = (char *)0x0;
  }
  else {
    iVar1 = LookupEnum((ulong)tval,type_table->values,type_table->num_elems);
    if ((iVar1 < 0) || ((long)type_table->num_elems <= iVar1)) {
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = type_table->names[iVar1];
    }
  }
  return pcStack_10;
}

Assistant:

const char *EnumName(T tval, const TypeTable *type_table) {
  if (!type_table || !type_table->names) return nullptr;
  auto i = LookupEnum(static_cast<int64_t>(tval), type_table->values,
                      type_table->num_elems);
  if (i >= 0 && i < static_cast<int64_t>(type_table->num_elems)) {
    return type_table->names[i];
  }
  return nullptr;
}